

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::BeginClone(Func *this,Lowerer *lowerer,JitArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Cloner *pCVar4;
  BaseDictionary<IR::Instr_*,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  
  if (this->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x589,"(this->IsTopFunc())","this->IsTopFunc()");
    if (!bVar2) goto LAB_0042f088;
    *puVar3 = 0;
  }
  if (this->m_cloner != (Cloner *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x58a,"(m_cloner == nullptr)","Starting new clone while one is in progress")
    ;
    if (!bVar2) goto LAB_0042f088;
    *puVar3 = 0;
  }
  pCVar4 = (Cloner *)new<Memory::JitArenaAllocator>(0x38,alloc,0x3f1274);
  pCVar4->alloc = alloc;
  pCVar4->symMap = (HashTable<StackSym_*,_Memory::ArenaAllocator> *)0x0;
  pCVar4->labelMap = (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *)0x0;
  pCVar4->lowerer = lowerer;
  pCVar4->instrFirst = (Instr *)0x0;
  pCVar4->instrLast = (Instr *)0x0;
  *(undefined8 *)((long)&pCVar4->instrLast + 5) = 0;
  this->m_cloner = pCVar4;
  if (this->m_cloneMap == (InstrMap *)0x0) {
    this_00 = (BaseDictionary<IR::Instr_*,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,alloc,0x3f1274);
    this_00->buckets = (Type)0x0;
    this_00->entries = (Type)0x0;
    this_00->alloc = alloc;
    this_00->size = 0;
    this_00->bucketCount = 0;
    this_00->count = 0;
    this_00->freeCount = 0;
    this_00->modFunctionIndex = 0x4b;
    if (alloc == (JitArenaAllocator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x8e,"(allocator)","allocator");
      if (!bVar2) {
LAB_0042f088:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this_00->stats = (Type)0x0;
    JsUtil::
    BaseDictionary<IR::Instr_*,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize(this_00,7);
    this->m_cloneMap = this_00;
  }
  return;
}

Assistant:

void
Func::BeginClone(Lowerer * lowerer, JitArenaAllocator *alloc)
{
    Assert(this->IsTopFunc());
    AssertMsg(m_cloner == nullptr, "Starting new clone while one is in progress");
    m_cloner = JitAnew(alloc, Cloner, lowerer, alloc);
    if (m_cloneMap == nullptr)
    {
         m_cloneMap = JitAnew(alloc, InstrMap, alloc, 7);
    }
}